

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O2

mi_page_t * mi_find_page(mi_heap_t *heap,size_t size,size_t huge_alignment)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  mi_heap_t *pmVar4;
  bool bVar5;
  byte bVar6;
  size_t sVar7;
  mi_heap_t *heap_00;
  size_t block_size;
  mi_tld_t *extraout_RDX;
  mi_tld_t *extraout_RDX_00;
  mi_tld_t *extraout_RDX_01;
  mi_tld_t *extraout_RDX_02;
  mi_tld_t *tld;
  mi_tld_t *extraout_RDX_03;
  ulong uVar8;
  mi_heap_t *pmVar9;
  mi_page_queue_t *queue;
  
  if ((size < 0x10001) && (huge_alignment == 0)) {
    sVar7 = mi_bin(size);
    heap_00 = (mi_heap_t *)heap->pages[sVar7].first;
    tld = extraout_RDX;
    if ((heap_00 == (mi_heap_t *)0x0) ||
       (_mi_page_free_collect((mi_page_t *)heap_00,false), tld = extraout_RDX_00,
       (mi_block_t *)heap_00->thread_id == (mi_block_t *)0x0)) {
      queue = heap->pages + sVar7;
      bVar6 = 1;
      do {
        pmVar9 = (mi_heap_t *)0x0;
        uVar8 = 0;
        pmVar4 = (mi_heap_t *)queue->first;
        while (heap_00 = pmVar4, uVar8 = uVar8 + 1, heap_00 != (mi_heap_t *)0x0) {
          pmVar4 = *(mi_heap_t **)((long)(heap_00->random).input + 0x10);
          _mi_page_free_collect((mi_page_t *)heap_00,false);
          if (((mi_block_t *)heap_00->thread_id == (mi_block_t *)0x0) &&
             (*(uint16_t *)((long)&heap_00->thread_delayed_free + 4) <=
              *(uint16_t *)((long)&heap_00->thread_delayed_free + 2))) {
            mi_page_to_full((mi_page_t *)heap_00,queue);
            tld = extraout_RDX_02;
          }
          else {
            if (pmVar9 == (mi_heap_t *)0x0) {
              uVar8 = 0;
              tld = extraout_RDX_01;
              pmVar9 = heap_00;
            }
            else {
              uVar2 = (ushort)heap_00->cookie;
              tld = (mi_tld_t *)(ulong)uVar2;
              if ((ushort)pmVar9->cookie <= uVar2) {
                uVar3 = *(uint16_t *)((long)&heap_00->thread_delayed_free + 4);
                tld = (mi_tld_t *)(ulong)(uint)(uVar3 >> 3);
                if (((int)(uint)(uVar3 >> 3) < (int)((uint)uVar3 - (uint)uVar2)) &&
                   (uVar3 <= *(uint16_t *)((long)&heap_00->thread_delayed_free + 2))) {
                  pmVar9 = heap_00;
                }
              }
            }
            if (((mi_block_t *)heap_00->thread_id != (mi_block_t *)0x0) || (4 < uVar8)) break;
          }
        }
        if (pmVar9 != (mi_heap_t *)0x0) {
          heap_00 = pmVar9;
        }
        if (heap_00 != (mi_heap_t *)0x0) {
          if (heap_00->thread_id == 0) {
            mi_page_extend_free(heap_00,(mi_page_t *)heap->tld,tld);
          }
          if ((mi_heap_t *)queue->first != heap_00) {
            mi_page_queue_remove(queue,(mi_page_t *)heap_00);
            mi_page_queue_push(heap,queue,(mi_page_t *)heap_00);
          }
          goto LAB_007cb8cd;
        }
        _mi_heap_collect_retired(heap,false);
        heap_00 = (mi_heap_t *)mi_page_fresh_alloc(heap,queue,heap->pages[sVar7].block_size,0);
        bVar5 = (bool)(bVar6 & heap_00 == (mi_heap_t *)0x0);
        bVar6 = 0;
        tld = extraout_RDX_03;
      } while (bVar5);
    }
    else {
LAB_007cb8cd:
      pbVar1 = (byte *)((long)&heap_00->thread_delayed_free + 7);
      *pbVar1 = *pbVar1 & 1;
    }
  }
  else if (size < 0xfffffffe0001) {
    block_size = _mi_os_good_alloc_size(size);
    sVar7 = block_size;
    if (0x1000000 < block_size) {
      sVar7 = 0x1000001;
    }
    if (huge_alignment != 0) {
      sVar7 = 0x1000001;
    }
    sVar7 = mi_bin(sVar7);
    heap_00 = (mi_heap_t *)mi_page_fresh_alloc(heap,heap->pages + sVar7,block_size,huge_alignment);
    if (heap_00 == (mi_heap_t *)0x0) {
      heap_00 = (mi_heap_t *)0x0;
    }
    else {
      _mi_stat_increase(&(heap->tld->stats).malloc_huge,heap_00->keys[0]);
      _mi_stat_counter_increase(&(heap->tld->stats).malloc_huge_count,1);
    }
  }
  else {
    heap_00 = (mi_heap_t *)0x0;
    _mi_error_message(0x4b,"allocation request is too large (%zu bytes)\n");
  }
  return (mi_page_t *)heap_00;
}

Assistant:

static mi_page_t* mi_find_page(mi_heap_t* heap, size_t size, size_t huge_alignment) mi_attr_noexcept {
  // huge allocation?
  const size_t req_size = size - MI_PADDING_SIZE;  // correct for padding_size in case of an overflow on `size`
  if mi_unlikely(req_size > (MI_MEDIUM_OBJ_SIZE_MAX - MI_PADDING_SIZE) || huge_alignment > 0) {
    if mi_unlikely(req_size > MI_MAX_ALLOC_SIZE) {
      _mi_error_message(EOVERFLOW, "allocation request is too large (%zu bytes)\n", req_size);
      return NULL;
    }